

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

gc_heap_ptr<mjs::regexp_object> __thiscall
mjs::regexp_object::make
          (regexp_object *this,gc_heap_ptr<mjs::global_object> *global,wstring_view *pattern,
          regexp_flag flags)

{
  wstring_view *args_1;
  global_object *pgVar1;
  gc_heap *args;
  undefined8 extraout_RDX;
  gc_heap_ptr<mjs::regexp_object> gVar2;
  wstring_view s;
  string local_48;
  string local_38;
  regexp_flag local_24;
  wstring_view *pwStack_20;
  regexp_flag flags_local;
  wstring_view *pattern_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  local_24 = flags;
  pwStack_20 = pattern;
  pattern_local = (wstring_view *)global;
  global_local = (gc_heap_ptr<mjs::global_object> *)this;
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->(global);
  args = object::heap(&pgVar1->super_object);
  args_1 = pattern_local;
  pgVar1 = gc_heap_ptr<mjs::global_object>::operator->
                     ((gc_heap_ptr<mjs::global_object> *)pattern_local);
  (*(pgVar1->super_object)._vptr_object[0xf])(&local_38);
  s._M_str = (wchar_t *)pwStack_20->_M_len;
  s._M_len = (size_t)pattern_local;
  anon_unknown_35::get_source_string((gc_heap_ptr<mjs::global_object> *)&local_48,s);
  gc_heap::
  make<mjs::regexp_object,mjs::gc_heap_ptr<mjs::global_object>const&,mjs::gc_heap_ptr<mjs::object>,mjs::string,mjs::regexp_flag&>
            ((gc_heap *)this,(gc_heap_ptr<mjs::global_object> *)args,
             (gc_heap_ptr<mjs::object> *)args_1,&local_38,(regexp_flag *)&local_48);
  string::~string(&local_48);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)&local_38);
  gVar2.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  gVar2.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (gc_heap_ptr<mjs::regexp_object>)gVar2.super_gc_heap_ptr_untyped;
}

Assistant:

static gc_heap_ptr<regexp_object> make(const gc_heap_ptr<global_object>& global, const std::wstring_view& pattern, regexp_flag flags) {
        return global->heap().make<regexp_object>(global, global->regexp_prototype(), get_source_string(global, pattern), flags);
    }